

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O2

void cmQtAutoGeneratorInitializer::InitializeAutogenTarget
               (cmLocalGenerator *lg,cmGeneratorTarget *target)

{
  cmMakefile *this;
  cmSourceFile *sourceFile;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  FileFormat FVar7;
  cmGlobalGenerator *pcVar8;
  char *pcVar9;
  string *psVar10;
  cmTarget *pcVar11;
  _Rb_tree_node_base *p_Var12;
  string *path;
  cmTarget *pcVar13;
  cmGeneratorTarget *this_00;
  cmState *pcVar14;
  string *libName;
  pointer pbVar15;
  pointer name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  autogenDepends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toolNames;
  string rccBuildFile;
  string autogenComment;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraDepends_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  suffixes;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  autogenDependsSet;
  string base;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  autogenProvides;
  cmCustomCommandLines commandLines;
  string autogenBuildDir;
  string qtMajorVersion;
  string autogenTargetName;
  string rccCommand;
  string workingDirectory;
  
  this = target->Target->Makefile;
  std::__cxx11::string::string((string *)&base,"AUTOMOC",(allocator *)&autogenDependsSet);
  bVar1 = cmGeneratorTarget::GetPropertyAsBool(target,&base);
  std::__cxx11::string::~string((string *)&base);
  std::__cxx11::string::string((string *)&base,"AUTOUIC",(allocator *)&autogenDependsSet);
  bVar2 = cmGeneratorTarget::GetPropertyAsBool(target,&base);
  std::__cxx11::string::~string((string *)&base);
  std::__cxx11::string::string((string *)&base,"AUTORCC",(allocator *)&autogenDependsSet);
  bVar3 = cmGeneratorTarget::GetPropertyAsBool(target,&base);
  std::__cxx11::string::~string((string *)&base);
  pcVar8 = cmGeneratorTarget::GetGlobalGenerator(target);
  iVar5 = (*pcVar8->_vptr_cmGlobalGenerator[0x1f])(pcVar8);
  GetAutogenTargetName_abi_cxx11_(&autogenTargetName,target);
  GetAutogenTargetBuildDir_abi_cxx11_(&autogenBuildDir,target);
  std::__cxx11::string::string((string *)&base,"",(allocator *)&autogenDependsSet);
  pcVar9 = cmMakefile::GetCurrentBinaryDirectory(this);
  cmsys::SystemTools::CollapseFullPath(&workingDirectory,&base,pcVar9);
  std::__cxx11::string::~string((string *)&base);
  GetQtMajorVersion_abi_cxx11_(&qtMajorVersion,target);
  RccGetExecutable(&rccCommand,target,&qtMajorVersion);
  suffixes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  suffixes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  suffixes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar8 = cmMakefile::GetGlobalGenerator(this);
  iVar6 = (*pcVar8->_vptr_cmGlobalGenerator[0x1f])(pcVar8);
  if ((char)iVar6 == '\0') {
LAB_003883f6:
    std::__cxx11::string::string((string *)&autogenDependsSet,"",(allocator *)&autogenComment);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&suffixes,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &autogenDependsSet);
    std::__cxx11::string::~string((string *)&autogenDependsSet);
  }
  else {
    cmMakefile::GetConfigurations(&base,this,&suffixes,true);
    std::__cxx11::string::~string((string *)&base);
    for (pbVar15 = suffixes.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar15 !=
        suffixes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar15 = pbVar15 + 1) {
      std::__cxx11::string::insert((ulong)pbVar15,(char *)0x0);
    }
    if (pbVar15 ==
        suffixes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) goto LAB_003883f6;
  }
  autogenDependsSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &autogenDependsSet._M_t._M_impl.super__Rb_tree_header._M_header;
  autogenDependsSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  autogenDependsSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  autogenDependsSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  autogenProvides.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  autogenProvides.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  autogenProvides.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  autogenDependsSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       autogenDependsSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string
            ((string *)&base,"ADDITIONAL_MAKE_CLEAN_FILES",(allocator *)&autogenComment);
  cmMakefile::AppendProperty(this,&base,autogenBuildDir._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&base);
  GetAutogenTargetFilesDir_abi_cxx11_(&base,target);
  for (pbVar15 = suffixes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbVar15 !=
      suffixes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pbVar15 = pbVar15 + 1) {
    std::operator+(&rccBuildFile,&base,"/AutogenOldSettings");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &autogenDepends,&rccBuildFile,pbVar15);
    std::operator+(&autogenComment,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &autogenDepends,".cmake");
    std::__cxx11::string::~string((string *)&autogenDepends);
    std::__cxx11::string::~string((string *)&rccBuildFile);
    std::__cxx11::string::string
              ((string *)&autogenDepends,"ADDITIONAL_MAKE_CLEAN_FILES",(allocator *)&rccBuildFile);
    cmMakefile::AppendProperty
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &autogenDepends,autogenComment._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&autogenDepends);
    std::__cxx11::string::~string((string *)&autogenComment);
  }
  std::__cxx11::string::~string((string *)&base);
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  autogenComment._M_dataplus._M_p = (pointer)0x0;
  autogenComment._M_string_length = 0;
  autogenComment.field_2._M_allocated_capacity = 0;
  psVar10 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&autogenComment,psVar10);
  std::__cxx11::string::string((string *)&base,"-E",(allocator *)&autogenDepends);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&autogenComment,
             &base);
  std::__cxx11::string::~string((string *)&base);
  std::__cxx11::string::string((string *)&base,"cmake_autogen",(allocator *)&autogenDepends);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&autogenComment,
             &base);
  std::__cxx11::string::~string((string *)&base);
  GetAutogenTargetFilesDir_abi_cxx11_(&base,target);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&autogenComment,
             &base);
  std::__cxx11::string::~string((string *)&base);
  std::__cxx11::string::string((string *)&base,"$<CONFIGURATION>",(allocator *)&autogenDepends);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&autogenComment,
             &base);
  std::__cxx11::string::~string((string *)&base);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
             (value_type *)&autogenComment);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&autogenComment);
  autogenComment._M_dataplus._M_p = (pointer)&autogenComment.field_2;
  autogenComment._M_string_length = 0;
  autogenComment.field_2._M_allocated_capacity =
       autogenComment.field_2._M_allocated_capacity & 0xffffffffffffff00;
  toolNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  toolNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  toolNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (bVar1) {
    std::__cxx11::string::string((string *)&base,"MOC",(allocator *)&autogenDepends);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&toolNames,&base
              );
    std::__cxx11::string::~string((string *)&base);
  }
  if (bVar2) {
    std::__cxx11::string::string((string *)&base,"UIC",(allocator *)&autogenDepends);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&toolNames,&base
              );
    std::__cxx11::string::~string((string *)&base);
  }
  if (bVar3) {
    std::__cxx11::string::string((string *)&base,"RCC",(allocator *)&autogenDepends);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&toolNames,&base
              );
    std::__cxx11::string::~string((string *)&base);
  }
  std::__cxx11::string::string
            ((string *)&base,
             (string *)
             toolNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&toolNames,
          (const_iterator)
          toolNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start);
  while( true ) {
    if ((ulong)((long)toolNames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)toolNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) break;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &autogenDepends,", ",
                   toolNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::append((string *)&base);
    std::__cxx11::string::~string((string *)&autogenDepends);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&toolNames,
            (const_iterator)
            toolNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((long)toolNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)toolNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x20) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &autogenDepends," and ",
                   toolNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::append((string *)&base);
    std::__cxx11::string::~string((string *)&autogenDepends);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &extraDepends_1,"Automatic ",&base);
  std::operator+(&rccBuildFile,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &extraDepends_1," for target ");
  psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &autogenDepends,&rccBuildFile,psVar10);
  std::__cxx11::string::operator=((string *)&autogenComment,(string *)&autogenDepends);
  std::__cxx11::string::~string((string *)&autogenDepends);
  std::__cxx11::string::~string((string *)&rccBuildFile);
  std::__cxx11::string::~string((string *)&extraDepends_1);
  std::__cxx11::string::~string((string *)&base);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&toolNames);
  if (bVar1) {
    std::operator+(&base,&autogenBuildDir,"/mocs_compilation.cpp");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&autogenProvides,&base);
    std::__cxx11::string::~string((string *)&base);
LAB_0038893d:
    std::operator+(&base,&autogenBuildDir,"/include");
    if ((char)iVar5 != '\0') {
      std::__cxx11::string::append((char *)&base);
    }
    cmGeneratorTarget::AddIncludeDirectory(target,&base,true);
    std::__cxx11::string::~string((string *)&base);
  }
  else if (bVar2) goto LAB_0038893d;
  std::__cxx11::string::string
            ((string *)&base,"AUTOGEN_TARGET_DEPENDS",(allocator *)&autogenDepends);
  pcVar9 = cmGeneratorTarget::GetProperty(target,&base);
  std::__cxx11::string::~string((string *)&base);
  if (pcVar9 != (char *)0x0) {
    autogenDepends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    autogenDepends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    autogenDepends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&base,pcVar9,(allocator *)&rccBuildFile);
    cmSystemTools::ExpandListArgument(&base,&autogenDepends,false);
    std::__cxx11::string::~string((string *)&base);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::
    _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&autogenDependsSet,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )autogenDepends.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )autogenDepends.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&autogenDepends);
  }
  pcVar13 = target->Target;
  for (p_Var12 = (pcVar13->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var12 != &(pcVar13->Utilities)._M_t._M_impl.super__Rb_tree_header;
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
    pcVar11 = cmMakefile::FindTargetToUse(this,(string *)(p_Var12 + 1),false);
    if (pcVar11 != (cmTarget *)0x0) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&autogenDependsSet,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var12 + 1))
      ;
    }
  }
  pcVar13 = target->Target;
  for (name = (pcVar13->OriginalLinkLibraries).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      name != (pcVar13->OriginalLinkLibraries).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; name = name + 1) {
    pcVar11 = cmMakefile::FindTargetToUse(this,&name->first,false);
    if (pcVar11 != (cmTarget *)0x0) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&autogenDependsSet,&name->first);
    }
  }
  cmFilePathChecksum::cmFilePathChecksum((cmFilePathChecksum *)&base,this);
  toolNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  toolNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  toolNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetConfigCommonSourceFiles
            (target,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&toolNames);
  for (pbVar15 = toolNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbVar15 !=
      toolNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pbVar15 = (pointer)&pbVar15->_M_string_length) {
    sourceFile = (cmSourceFile *)(pbVar15->_M_dataplus)._M_p;
    bVar4 = PropertyEnabled(sourceFile,"SKIP_AUTOGEN");
    if (!bVar4) {
      psVar10 = cmSourceFile::GetExtension_abi_cxx11_(sourceFile);
      if (bVar1 || bVar2) {
        FVar7 = cmSystemTools::GetFileFormat((psVar10->_M_dataplus)._M_p);
        if ((FVar7 == HEADER_FILE_FORMAT) || (FVar7 == CXX_FILE_FORMAT)) {
          bVar4 = PropertyEnabled(sourceFile,"GENERATED");
          if (bVar4) {
            if (bVar1) {
              bVar4 = PropertyEnabled(sourceFile,"SKIP_AUTOMOC");
              if (bVar4) goto LAB_00388ba0;
LAB_00388bba:
              path = cmSourceFile::GetFullPath(sourceFile,(string *)0x0);
              cmsys::SystemTools::GetRealPath((string *)&autogenDepends,path,(string *)0x0);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&autogenDependsSet,(string *)&autogenDepends);
              std::__cxx11::string::~string((string *)&autogenDepends);
            }
            else {
LAB_00388ba0:
              if (bVar2) {
                bVar4 = PropertyEnabled(sourceFile,"SKIP_AUTOUIC");
                if (!bVar4) goto LAB_00388bba;
              }
            }
          }
        }
      }
      if (bVar3) {
        bVar4 = std::operator==(psVar10,"qrc");
        if (bVar4) {
          bVar4 = PropertyEnabled(sourceFile,"SKIP_AUTORCC");
          if (!bVar4) {
            psVar10 = cmSourceFile::GetFullPath(sourceFile,(string *)0x0);
            cmsys::SystemTools::GetRealPath((string *)&autogenDepends,psVar10,(string *)0x0);
            std::operator+(&rccBuildFile,&autogenBuildDir,"/");
            cmFilePathChecksum::getPart
                      ((string *)&extraDepends_1,(cmFilePathChecksum *)&base,
                       (string *)&autogenDepends,10);
            std::__cxx11::string::append((string *)&rccBuildFile);
            std::__cxx11::string::~string((string *)&extraDepends_1);
            std::__cxx11::string::append((char *)&rccBuildFile);
            cmsys::SystemTools::GetFilenameWithoutLastExtension
                      ((string *)&extraDepends_1,(string *)&autogenDepends);
            std::__cxx11::string::append((string *)&rccBuildFile);
            std::__cxx11::string::~string((string *)&extraDepends_1);
            std::__cxx11::string::append((char *)&rccBuildFile);
            AddGeneratedSource(this,&rccBuildFile,RCC);
            cmGeneratorTarget::AddSource(target,&rccBuildFile);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&autogenProvides,&rccBuildFile);
            std::__cxx11::string::~string((string *)&rccBuildFile);
            bVar4 = PropertyEnabled(sourceFile,"GENERATED");
            if (bVar4) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&autogenDependsSet,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &autogenDepends);
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&this->ListFiles,(value_type *)&autogenDepends);
              rccBuildFile._M_dataplus._M_p = (pointer)&rccBuildFile.field_2;
              rccBuildFile._M_string_length = 0;
              rccBuildFile.field_2._M_local_buf[0] = '\0';
              extraDepends_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              extraDepends_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              extraDepends_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              bVar4 = cmQtAutoGeneratorCommon::RccListInputs
                                (&qtMajorVersion,&rccCommand,(string *)&autogenDepends,
                                 &extraDepends_1,&rccBuildFile);
              if (bVar4) {
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::
                _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&autogenDependsSet,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )extraDepends_1.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )extraDepends_1.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
              }
              else {
                cmSystemTools::Error
                          (rccBuildFile._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&extraDepends_1);
              std::__cxx11::string::~string((string *)&rccBuildFile);
            }
            std::__cxx11::string::~string((string *)&autogenDepends);
          }
        }
      }
    }
  }
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
            ((_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&toolNames);
  cmFilePathChecksum::~cmFilePathChecksum((cmFilePathChecksum *)&base);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&autogenDepends,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )autogenDependsSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )&autogenDependsSet._M_t._M_impl.super__Rb_tree_header,(allocator_type *)&base);
  pcVar13 = cmMakefile::AddUtilityCommand
                      (this,&autogenTargetName,true,workingDirectory._M_dataplus._M_p,
                       &autogenProvides,&autogenDepends,&commandLines,false,
                       autogenComment._M_dataplus._M_p,false,false);
  this_00 = (cmGeneratorTarget *)operator_new(0x570);
  cmGeneratorTarget::cmGeneratorTarget(this_00,pcVar13,lg);
  cmLocalGenerator::AddGeneratorTarget(lg,this_00);
  pcVar14 = cmMakefile::GetState(this);
  std::__cxx11::string::string((string *)&base,"AUTOMOC_TARGETS_FOLDER",(allocator *)&rccBuildFile);
  pcVar9 = cmState::GetGlobalProperty(pcVar14,&base);
  std::__cxx11::string::~string((string *)&base);
  if (pcVar9 == (char *)0x0) {
    pcVar14 = cmMakefile::GetState(this);
    std::__cxx11::string::string
              ((string *)&base,"AUTOGEN_TARGETS_FOLDER",(allocator *)&rccBuildFile);
    pcVar9 = cmState::GetGlobalProperty(pcVar14,&base);
    std::__cxx11::string::~string((string *)&base);
    if (pcVar9 != (char *)0x0) goto LAB_00388f42;
  }
  else {
LAB_00388f42:
    if (*pcVar9 != '\0') {
      std::__cxx11::string::string((string *)&base,"FOLDER",(allocator *)&rccBuildFile);
      cmTarget::SetProperty(pcVar13,&base,pcVar9);
      goto LAB_00388fc2;
    }
  }
  pcVar13 = this_00->Target;
  pcVar11 = target->Target;
  std::__cxx11::string::string((string *)&base,"FOLDER",(allocator *)&rccBuildFile);
  pcVar9 = cmTarget::GetProperty(pcVar11,&base);
  if (pcVar9 != (char *)0x0) {
    cmTarget::SetProperty(pcVar13,&base,pcVar9);
  }
LAB_00388fc2:
  std::__cxx11::string::~string((string *)&base);
  cmTarget::AddUtility(target->Target,&autogenTargetName,(cmMakefile *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&autogenDepends);
  std::__cxx11::string::~string((string *)&autogenComment);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&autogenProvides);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&autogenDependsSet._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&suffixes);
  std::__cxx11::string::~string((string *)&rccCommand);
  std::__cxx11::string::~string((string *)&qtMajorVersion);
  std::__cxx11::string::~string((string *)&workingDirectory);
  std::__cxx11::string::~string((string *)&autogenBuildDir);
  std::__cxx11::string::~string((string *)&autogenTargetName);
  return;
}

Assistant:

void cmQtAutoGeneratorInitializer::InitializeAutogenTarget(
  cmLocalGenerator* lg, cmGeneratorTarget* target)
{
  cmMakefile* makefile = target->Target->GetMakefile();

  // Create a custom target for running generators at buildtime
  const bool mocEnabled = target->GetPropertyAsBool("AUTOMOC");
  const bool uicEnabled = target->GetPropertyAsBool("AUTOUIC");
  const bool rccEnabled = target->GetPropertyAsBool("AUTORCC");
  const bool multiConfig = IsMultiConfig(target->GetGlobalGenerator());
  const std::string autogenTargetName = GetAutogenTargetName(target);
  const std::string autogenBuildDir = GetAutogenTargetBuildDir(target);
  const std::string workingDirectory =
    cmSystemTools::CollapseFullPath("", makefile->GetCurrentBinaryDirectory());
  const std::string qtMajorVersion = GetQtMajorVersion(target);
  const std::string rccCommand = RccGetExecutable(target, qtMajorVersion);
  const std::vector<std::string> suffixes = GetConfigurationSuffixes(makefile);
  std::set<std::string> autogenDependsSet;
  std::vector<std::string> autogenProvides;

  // Remove build directories on cleanup
  makefile->AppendProperty("ADDITIONAL_MAKE_CLEAN_FILES",
                           autogenBuildDir.c_str(), false);

  // Remove old settings on cleanup
  {
    std::string base = GetAutogenTargetFilesDir(target);
    for (std::vector<std::string>::const_iterator it = suffixes.begin();
         it != suffixes.end(); ++it) {
      std::string fname = base + "/AutogenOldSettings" + *it + ".cmake";
      makefile->AppendProperty("ADDITIONAL_MAKE_CLEAN_FILES", fname.c_str(),
                               false);
    }
  }

  // Compose command lines
  cmCustomCommandLines commandLines;
  {
    cmCustomCommandLine currentLine;
    currentLine.push_back(cmSystemTools::GetCMakeCommand());
    currentLine.push_back("-E");
    currentLine.push_back("cmake_autogen");
    currentLine.push_back(GetAutogenTargetFilesDir(target));
    currentLine.push_back("$<CONFIGURATION>");
    commandLines.push_back(currentLine);
  }

  // Compose target comment
  std::string autogenComment;
  {
    std::vector<std::string> toolNames;
    if (mocEnabled) {
      toolNames.push_back("MOC");
    }
    if (uicEnabled) {
      toolNames.push_back("UIC");
    }
    if (rccEnabled) {
      toolNames.push_back("RCC");
    }

    std::string tools = toolNames[0];
    toolNames.erase(toolNames.begin());
    while (toolNames.size() > 1) {
      tools += ", " + toolNames[0];
      toolNames.erase(toolNames.begin());
    }
    if (toolNames.size() == 1) {
      tools += " and " + toolNames[0];
    }
    autogenComment = "Automatic " + tools + " for target " + target->GetName();
  }

  // Add moc compilation to generated files list
  if (mocEnabled) {
    const std::string mocsComp = autogenBuildDir + "/mocs_compilation.cpp";
    autogenProvides.push_back(mocsComp);
  }

  // Add autogen includes directory to the origin target INCLUDE_DIRECTORIES
  if (mocEnabled || uicEnabled) {
    std::string includeDir = autogenBuildDir + "/include";
    if (multiConfig) {
      includeDir += "_$<CONFIG>";
    }
    target->AddIncludeDirectory(includeDir, true);
  }

#if defined(_WIN32) && !defined(__CYGWIN__)
  bool usePRE_BUILD = false;
  cmGlobalGenerator* gg = lg->GetGlobalGenerator();
  if (gg->GetName().find("Visual Studio") != std::string::npos) {
    // Under VS use a PRE_BUILD event instead of a separate target to
    // reduce the number of targets loaded into the IDE.
    // This also works around a VS 11 bug that may skip updating the target:
    //  https://connect.microsoft.com/VisualStudio/feedback/details/769495
    usePRE_BUILD = true;
  }
#endif

  // Initialize autogen target dependencies
  if (const char* deps = target->GetProperty("AUTOGEN_TARGET_DEPENDS")) {
    std::vector<std::string> extraDepends;
    cmSystemTools::ExpandListArgument(deps, extraDepends);
    autogenDependsSet.insert(extraDepends.begin(), extraDepends.end());
  }
  // Add other target dependencies autogen dependencies
  {
    const std::set<std::string>& utils = target->Target->GetUtilities();
    for (std::set<std::string>::const_iterator it = utils.begin();
         it != utils.end(); ++it) {
      const std::string& targetName = *it;
      if (makefile->FindTargetToUse(targetName) != CM_NULLPTR) {
        autogenDependsSet.insert(targetName);
      }
    }
  }
  // Add link library targets to the autogen dependencies
  {
    const cmTarget::LinkLibraryVectorType& libVec =
      target->Target->GetOriginalLinkLibraries();
    for (cmTarget::LinkLibraryVectorType::const_iterator it = libVec.begin();
         it != libVec.end(); ++it) {
      const std::string& libName = it->first;
      if (makefile->FindTargetToUse(libName) != CM_NULLPTR) {
        autogenDependsSet.insert(libName);
      }
    }
  }
  {
    cmFilePathChecksum fpathCheckSum(makefile);
    // Iterate over all source files
    std::vector<cmSourceFile*> srcFiles;
    target->GetConfigCommonSourceFiles(srcFiles);
    for (std::vector<cmSourceFile*>::const_iterator fileIt = srcFiles.begin();
         fileIt != srcFiles.end(); ++fileIt) {
      cmSourceFile* sf = *fileIt;
      if (!PropertyEnabled(sf, "SKIP_AUTOGEN")) {
        std::string const& ext = sf->GetExtension();
        // Add generated file that will be scanned by moc or uic to
        // the dependencies
        if (mocEnabled || uicEnabled) {
          const cmSystemTools::FileFormat fileType =
            cmSystemTools::GetFileFormat(ext.c_str());
          if ((fileType == cmSystemTools::CXX_FILE_FORMAT) ||
              (fileType == cmSystemTools::HEADER_FILE_FORMAT)) {
            if (PropertyEnabled(sf, "GENERATED")) {
              if ((mocEnabled && !PropertyEnabled(sf, "SKIP_AUTOMOC")) ||
                  (uicEnabled && !PropertyEnabled(sf, "SKIP_AUTOUIC"))) {
                autogenDependsSet.insert(
                  cmsys::SystemTools::GetRealPath(sf->GetFullPath()));
#if defined(_WIN32) && !defined(__CYGWIN__)
                // Cannot use PRE_BUILD with generated files
                usePRE_BUILD = false;
#endif
              }
            }
          }
        }
        // Process rcc enabled files
        if (rccEnabled && (ext == "qrc") &&
            !PropertyEnabled(sf, "SKIP_AUTORCC")) {
          const std::string absFile =
            cmsys::SystemTools::GetRealPath(sf->GetFullPath());

          // Compose rcc output file name
          {
            std::string rccBuildFile = autogenBuildDir + "/";
            rccBuildFile += fpathCheckSum.getPart(absFile);
            rccBuildFile += "/qrc_";
            rccBuildFile +=
              cmsys::SystemTools::GetFilenameWithoutLastExtension(absFile);
            rccBuildFile += ".cpp";

            // Register rcc ouput file as generated
            AddGeneratedSource(makefile, rccBuildFile,
                               cmQtAutoGeneratorCommon::RCC);
            // Add rcc output file to origin target sources
            target->AddSource(rccBuildFile);
            // Register rcc ouput file as generated by the _autogen target
            autogenProvides.push_back(rccBuildFile);
          }

          if (PropertyEnabled(sf, "GENERATED")) {
            // Add generated qrc file to the dependencies
            autogenDependsSet.insert(absFile);
          } else {
            // Run cmake again when .qrc file changes
            makefile->AddCMakeDependFile(absFile);
            // Add the qrc input files to the dependencies
            {
              std::string error;
              std::vector<std::string> extraDepends;
              if (cmQtAutoGeneratorCommon::RccListInputs(
                    qtMajorVersion, rccCommand, absFile, extraDepends,
                    &error)) {
                autogenDependsSet.insert(extraDepends.begin(),
                                         extraDepends.end());
              } else {
                cmSystemTools::Error(error.c_str());
              }
            }
          }
#if defined(_WIN32) && !defined(__CYGWIN__)
          // Cannot use PRE_BUILD because the resource files themselves
          // may not be sources within the target so VS may not know the
          // target needs to re-build at all.
          usePRE_BUILD = false;
#endif
        }
      }
    }
  }

  // Convert std::set to std::vector
  const std::vector<std::string> autogenDepends(autogenDependsSet.begin(),
                                                autogenDependsSet.end());
#if defined(_WIN32) && !defined(__CYGWIN__)
  if (usePRE_BUILD) {
    // If the autogen target depends on an other target don't use PRE_BUILD
    for (std::vector<std::string>::const_iterator it = autogenDepends.begin();
         it != autogenDepends.end(); ++it) {
      if (makefile->FindTargetToUse(*it) != CM_NULLPTR) {
        usePRE_BUILD = false;
        break;
      }
    }
  }
  if (usePRE_BUILD) {
    // Add the pre-build command directly to bypass the OBJECT_LIBRARY
    // rejection in cmMakefile::AddCustomCommandToTarget because we know
    // PRE_BUILD will work for an OBJECT_LIBRARY in this specific case.
    std::vector<std::string> no_output;
    cmCustomCommand cc(makefile, no_output, autogenProvides, autogenDepends,
                       commandLines, autogenComment.c_str(),
                       workingDirectory.c_str());
    cc.SetEscapeOldStyle(false);
    cc.SetEscapeAllowMakeVars(true);
    target->Target->AddPreBuildCommand(cc);
  } else
#endif
  {
    cmTarget* autogenTarget = makefile->AddUtilityCommand(
      autogenTargetName, true, workingDirectory.c_str(),
      /*byproducts=*/autogenProvides, autogenDepends, commandLines, false,
      autogenComment.c_str());

    cmGeneratorTarget* gt = new cmGeneratorTarget(autogenTarget, lg);
    lg->AddGeneratorTarget(gt);

    // Set target folder
    const char* autogenFolder =
      makefile->GetState()->GetGlobalProperty("AUTOMOC_TARGETS_FOLDER");
    if (!autogenFolder) {
      autogenFolder =
        makefile->GetState()->GetGlobalProperty("AUTOGEN_TARGETS_FOLDER");
    }
    if (autogenFolder && *autogenFolder) {
      autogenTarget->SetProperty("FOLDER", autogenFolder);
    } else {
      // inherit FOLDER property from target (#13688)
      utilCopyTargetProperty(gt->Target, target->Target, "FOLDER");
    }

    target->Target->AddUtility(autogenTargetName);
  }
}